

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
GetBbrDataset(std::function<void(ot::commissioner::BbrDataset_const*,ot::commissioner::Error)>,unsigned_short)
::$_0::__0(__0 *this,anon_class_48_3_e6543253 *param_1)

{
  anon_class_48_3_e6543253 *param_1_local;
  anon_class_48_3_e6543253 *this_local;
  
  *(CommissionerSafe **)this = param_1->this;
  std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
            ((function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *)
             (this + 8),&param_1->aHandler);
  *(uint16_t *)(this + 0x28) = param_1->aDatasetFlags;
  return;
}

Assistant:

Error CommissionerSafe::GetBbrDataset(BbrDataset &aDataset, uint16_t aDatasetFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aDataset](const BbrDataset *dataset, Error error) {
        if (dataset != nullptr)
        {
            aDataset = *dataset;
        }
        pro.set_value(error);
    };

    GetBbrDataset(wait, aDatasetFlags);
    return pro.get_future().get();
}